

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MouseInputHandler_glfw.cpp
# Opt level: O3

void anon_unknown.dwarf_83ac6::_internalMouseButtonPressedCallback
               (GLFWwindow *window,int button,int action,int mods)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar2;
  void *pvVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  pointer psVar7;
  vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_> local_58;
  pointer local_40;
  undefined1 local_31;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
  vector(&local_58,
         (vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_> *)
         ((long)pvVar3 + 0x38));
  if (local_58.
      super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_31 = action != 0;
    local_40 = local_58.
               super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    psVar6 = local_58.
             super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar7 = local_58.
             super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      peVar1 = (psVar6->super___shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this = (psVar6->super___shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      iVar2 = (**peVar1->_vptr_InputHandler)(peVar1);
      if (iVar2 == 2) {
        lVar4 = __dynamic_cast(peVar1,&InputHandler::typeinfo,&MouseInputHandler::typeinfo,0);
        psVar7 = local_40;
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (lVar4 != 0 && this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var5 = this;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
        }
        if (button == 2) {
          *(undefined1 *)(lVar4 + 0x59) = local_31;
        }
        else if (button == 1) {
          *(undefined1 *)(lVar4 + 0x5a) = local_31;
        }
        else if (button == 0) {
          *(undefined1 *)(lVar4 + 0x58) = local_31;
        }
        *(undefined1 *)(lVar4 + 0x62) = 1;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar7);
  }
  std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
  ~vector(&local_58);
  return;
}

Assistant:

void _internalMouseButtonPressedCallback(GLFWwindow* window, int button, int action, int mods) {
        Application* app = (Application*)glfwGetWindowUserPointer(window);
        for (auto handler : app->inputHandlers()) {
            if (handler->type() == InputType::Mouse) {
                std::dynamic_pointer_cast<MouseInputHandler>(handler)->mouseButtonPressed(button, action, mods);
            }
        }
    }